

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void setOutputFile(QString *file,QString *format)

{
  long lVar1;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar2;
  char16_t *pcVar3;
  ulong uVar4;
  QArrayData *pQVar5;
  qsizetype qVar6;
  Data *pDVar7;
  undefined8 uVar8;
  Node<QString,_QString> *pNVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QAnyStringView QVar11;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  TryEmplaceResult local_58;
  TryEmplaceResult *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((format->d).size == 0) {
    QVar10.m_data = "txt";
    QVar10.m_size = 3;
    QString::operator=(format,QVar10);
  }
  lVar1 = (file->d).size;
  if ((lVar1 != 0) && ((lVar1 != 1 || (*(file->d).ptr != L'-')))) {
    QHash<QString,QString>::tryEmplace_impl<QString_const&>(&local_58,&g_options.outFiles,format);
    QString::operator=((QString *)
                       ((((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->
                        storage).data +
                       (ulong)((uint)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7]
                                     .offsets[(uint)local_58.iterator.i.bucket & 0x7f] * 0x30) +
                       0x18),(QString *)file);
    goto LAB_0010ce87;
  }
  if (g_options.outFiles.d == (Data *)0x0) {
LAB_0010cd1a:
    local_58.iterator.i.bucket = (size_t)(format->d).ptr;
    local_58._16_8_ = (format->d).size | 0x8000000000000000;
    local_38 = &local_58;
    local_58.iterator.i.d =
         (Data<QHashPrivate::Node<QString,_QString>_> *)CONCAT71(local_58.iterator.i.d._1_7_,1);
    uStack_30 = 0;
    QVar11.m_size = (size_t)"stdout.%1";
    QVar11.field_0.m_data = &local_78;
    QtPrivate::argToQString(QVar11,0x4000000000000009,(ArgBase **)0x1);
    pQVar5 = &((file->d).d)->super_QArrayData;
    pcVar3 = (file->d).ptr;
    (file->d).d = (Data *)local_78;
    (file->d).ptr = pcStack_70;
    qVar6 = (file->d).size;
    (file->d).size = local_68;
    local_78 = pQVar5;
    pcStack_70 = pcVar3;
    local_68 = qVar6;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    QHash<QString,QString>::tryEmplace_impl<QString_const&>(&local_58,&g_options.outFiles,format);
    QString::operator=((QString *)
                       ((((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->
                        storage).data +
                       (ulong)((uint)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7]
                                     .offsets[(uint)local_58.iterator.i.bucket & 0x7f] * 0x30) +
                       0x18),(QString *)file);
  }
  else {
    pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::findNode<QString>
                       (g_options.outFiles.d,format);
    if (pNVar9 == (Node<QString,_QString> *)0x0) goto LAB_0010cd1a;
    QHash<QString,_QString>::value((QString *)&local_58,&g_options.outFiles,format);
    pDVar2 = (Data<QHashPrivate::Node<QString,_QString>_> *)(file->d).d;
    pcVar3 = (file->d).ptr;
    (file->d).d = (Data *)local_58.iterator.i.d;
    (file->d).ptr = (char16_t *)local_58.iterator.i.bucket;
    uVar4 = (file->d).size;
    (file->d).size = local_58._16_8_;
    local_58.iterator.i.d = pDVar2;
    local_58.iterator.i.bucket = (size_t)pcVar3;
    local_58._16_8_ = uVar4;
    if (pDVar2 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pDVar2,2,0x10);
      }
    }
  }
  QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)file);
  QFileInfo::fileName();
  uVar8 = local_58._16_8_;
  pDVar2 = local_58.iterator.i.d;
  pcVar3 = g_options.stdoutFileName.d.ptr;
  pDVar7 = g_options.stdoutFileName.d.d;
  local_58.iterator.i.d =
       (Data<QHashPrivate::Node<QString,_QString>_> *)g_options.stdoutFileName.d.d;
  g_options.stdoutFileName.d.d = (Data *)pDVar2;
  g_options.stdoutFileName.d.ptr = (char16_t *)local_58.iterator.i.bucket;
  local_58.iterator.i.bucket = (size_t)pcVar3;
  local_58._16_8_ = g_options.stdoutFileName.d.size;
  g_options.stdoutFileName.d.size = uVar8;
  if (pDVar7 != (Data *)0x0) {
    LOCK();
    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_78);
LAB_0010ce87:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void setOutputFile(QString file, QString format)
{
    if (format.isEmpty())
        format = "txt"_L1;

    if ((file.isEmpty() || file == u'-')) {
        if (g_options.outFiles.contains(format)) {
            file = g_options.outFiles.value(format);
        } else {
            file = "stdout.%1"_L1.arg(format);
            g_options.outFiles[format] = file;
        }
        g_options.stdoutFileName = QFileInfo(file).fileName();
    } else {
        g_options.outFiles[format] = file;
    }
}